

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_rldimi(DisasContext_conflict10 *ctx,int mbn,int shn)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 ret;
  TCGv_i64 arg1;
  uint32_t uVar1;
  uint arg2;
  uint uVar2;
  uint uVar3;
  target_ulong arg2_00;
  TCGv_i64 ret_00;
  TCGv_i64 t1;
  target_ulong mask;
  uint32_t me;
  uint32_t mb;
  uint32_t sh;
  TCGv_i64 t_rs;
  TCGv_i64 t_ra;
  TCGContext_conflict10 *tcg_ctx;
  int shn_local;
  int mbn_local;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = rA(ctx->opcode);
  ret = cpu_gpr[uVar1];
  uVar1 = rS(ctx->opcode);
  arg1 = cpu_gpr[uVar1];
  uVar1 = SH(ctx->opcode);
  arg2 = uVar1 | shn << 5;
  uVar1 = MB(ctx->opcode);
  uVar2 = uVar1 | mbn << 5;
  uVar3 = 0x3f - arg2;
  if (uVar3 < uVar2) {
    arg2_00 = MASK((ulong)uVar2,(ulong)uVar3);
    ret_00 = tcg_temp_new_i64(tcg_ctx_00);
    tcg_gen_rotli_i64_ppc64(tcg_ctx_00,ret_00,arg1,arg2);
    tcg_gen_andi_i64_ppc64(tcg_ctx_00,ret_00,ret_00,arg2_00);
    tcg_gen_andi_i64_ppc64(tcg_ctx_00,ret,ret,arg2_00 ^ 0xffffffffffffffff);
    tcg_gen_or_i64_ppc64(tcg_ctx_00,ret,ret,ret_00);
    tcg_temp_free_i64(tcg_ctx_00,ret_00);
  }
  else {
    tcg_gen_deposit_i64_ppc64(tcg_ctx_00,ret,ret,arg1,arg2,(uVar3 - uVar2) + 1);
  }
  uVar1 = Rc(ctx->opcode);
  if (uVar1 != 0) {
    gen_set_Rc0(ctx,ret);
  }
  return;
}

Assistant:

static void gen_rldimi(DisasContext *ctx, int mbn, int shn)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t_ra = cpu_gpr[rA(ctx->opcode)];
    TCGv t_rs = cpu_gpr[rS(ctx->opcode)];
    uint32_t sh = SH(ctx->opcode) | (shn << 5);
    uint32_t mb = MB(ctx->opcode) | (mbn << 5);
    uint32_t me = 63 - sh;

    if (mb <= me) {
        tcg_gen_deposit_tl(tcg_ctx, t_ra, t_ra, t_rs, sh, me - mb + 1);
    } else {
        target_ulong mask = MASK(mb, me);
        TCGv t1 = tcg_temp_new(tcg_ctx);

        tcg_gen_rotli_tl(tcg_ctx, t1, t_rs, sh);
        tcg_gen_andi_tl(tcg_ctx, t1, t1, mask);
        tcg_gen_andi_tl(tcg_ctx, t_ra, t_ra, ~mask);
        tcg_gen_or_tl(tcg_ctx, t_ra, t_ra, t1);
        tcg_temp_free(tcg_ctx, t1);
    }
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, t_ra);
    }
}